

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

size_t mpeg_bitstream_parse
                 (mpeg_bitstream_t *packet,caption_frame_t *frame,uint8_t *data,size_t size,
                 uint stream_type,double dts,double cts)

{
  uint8_t uVar1;
  libcaption_stauts_t lVar2;
  sei_msgtype_t sVar3;
  uint8_t *data_00;
  size_t in_RCX;
  void *in_RDX;
  mpeg_bitstream_t *in_RDI;
  uint in_R8D;
  bool bVar4;
  cea708_t *cea708_1;
  sei_message_t *msg;
  cea708_t *cea708;
  size_t scpos;
  size_t header_size;
  sei_t sei;
  cea708_t *in_stack_ffffffffffffff58;
  mpeg_bitstream_t *in_stack_ffffffffffffff60;
  libcaption_stauts_t in_stack_ffffffffffffff68;
  libcaption_stauts_t in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  libcaption_stauts_t in_stack_ffffffffffffff74;
  sei_message_t *local_78;
  cea708_t *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  sei_t *in_stack_ffffffffffffffa8;
  size_t local_28;
  size_t local_8;
  
  if (in_RDI->size < 0x600000) {
    local_28 = in_RCX;
    if (0x5fffff < in_RDI->size + in_RCX) {
      local_28 = 0x600000 - in_RDI->size;
    }
    in_RDI->status = LIBCAPTION_OK;
    memcpy(in_RDI->data + in_RDI->size,in_RDX,local_28);
    in_RDI->size = local_28 + in_RDI->size;
    while( true ) {
      bVar4 = false;
      if (in_RDI->status == LIBCAPTION_OK) {
        in_stack_ffffffffffffff98 = (uint8_t *)find_start_code(in_RDI->data,in_RDI->size);
        bVar4 = in_stack_ffffffffffffff98 != (uint8_t *)0x0;
      }
      if (!bVar4) break;
      uVar1 = mpeg_bitstream_packet_type(in_RDI,in_R8D);
      if ((uVar1 == '\x06') || (uVar1 == '\'')) {
        if (in_R8D == 0x1b) {
          in_stack_ffffffffffffff70 = 4;
        }
        else {
          in_stack_ffffffffffffff70 = 0;
          if (in_R8D == 0x24) {
            in_stack_ffffffffffffff70 = 5;
          }
        }
        data_00 = (uint8_t *)(long)in_stack_ffffffffffffff70;
        if ((data_00 != (uint8_t *)0x0) && (data_00 < in_stack_ffffffffffffff98)) {
          in_stack_ffffffffffffff6c = in_RDI->status;
          lVar2 = sei_parse(in_stack_ffffffffffffffa8,data_00,(size_t)in_stack_ffffffffffffff98,
                            (double)in_stack_ffffffffffffff90);
          lVar2 = libcaption_status_update(in_stack_ffffffffffffff6c,lVar2);
          in_RDI->status = lVar2;
          for (local_78 = sei_message_head((sei_t *)&stack0xffffffffffffffa8);
              local_78 != (sei_message_t *)0x0; local_78 = sei_message_next(local_78)) {
            sVar3 = sei_message_type(local_78);
            if (sVar3 == sei_type_user_data_registered_itu_t_t35) {
              _mpeg_bitstream_cea708_emplace_back
                        (in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
              in_stack_ffffffffffffff68 = in_RDI->status;
              in_stack_ffffffffffffff60 = (mpeg_bitstream_t *)sei_message_data(local_78);
              sei_message_size(local_78);
              lVar2 = cea708_parse_h264((uint8_t *)
                                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ),(size_t)in_stack_ffffffffffffff60,
                                        in_stack_ffffffffffffff58);
              lVar2 = libcaption_status_update(in_stack_ffffffffffffff68,lVar2);
              in_RDI->status = lVar2;
              _mpeg_bitstream_cea708_sort_flush
                        ((mpeg_bitstream_t *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (caption_frame_t *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (double)in_stack_ffffffffffffff60);
            }
          }
          sei_free((sei_t *)in_stack_ffffffffffffff60);
        }
      }
      else if (((uVar1 == 0xb2) && (in_R8D == 2)) && ((uint8_t *)0x4 < in_stack_ffffffffffffff98)) {
        in_stack_ffffffffffffff90 =
             _mpeg_bitstream_cea708_emplace_back
                       (in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff74 = in_RDI->status;
        lVar2 = cea708_parse_h262((uint8_t *)
                                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                  (size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        lVar2 = libcaption_status_update(in_stack_ffffffffffffff74,lVar2);
        in_RDI->status = lVar2;
        _mpeg_bitstream_cea708_sort_flush
                  ((mpeg_bitstream_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                   ,(caption_frame_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                   ,(double)in_stack_ffffffffffffff60);
      }
      in_RDI->size = in_RDI->size - (long)in_stack_ffffffffffffff98;
      memmove(in_RDI->data,in_RDI->data + (long)in_stack_ffffffffffffff98,in_RDI->size);
    }
    local_8 = local_28;
  }
  else {
    in_RDI->status = LIBCAPTION_ERROR;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t mpeg_bitstream_parse(mpeg_bitstream_t* packet, caption_frame_t* frame, const uint8_t* data, size_t size, unsigned stream_type, double dts, double cts)
{
    if (MAX_NALU_SIZE <= packet->size) {
        packet->status = LIBCAPTION_ERROR;
        // fprintf(stderr, "LIBCAPTION_ERROR\n");
        return 0;
    }

    // consume upto MAX_NALU_SIZE bytes
    if (MAX_NALU_SIZE <= packet->size + size) {
        size = MAX_NALU_SIZE - packet->size;
    }

    sei_t sei;
    size_t header_size, scpos;
    packet->status = LIBCAPTION_OK;
    memcpy(&packet->data[packet->size], data, size);
    packet->size += size;

    while (packet->status == LIBCAPTION_OK && 0 < (scpos = find_start_code(&packet->data[0], packet->size))) {
        switch (mpeg_bitstream_packet_type(packet, stream_type)) {
        default:
            break;
        case H262_SEI_PACKET:
            header_size = 4;
            if (STREAM_TYPE_H262 == stream_type && scpos > header_size) {
                cea708_t* cea708 = _mpeg_bitstream_cea708_emplace_back(packet, dts + cts);
                packet->status = libcaption_status_update(packet->status, cea708_parse_h262(&packet->data[header_size], scpos - header_size, cea708));
                _mpeg_bitstream_cea708_sort_flush(packet, frame, dts);
            }
            break;
        case H264_SEI_PACKET:
        case H265_SEI_PACKET:
            header_size = STREAM_TYPE_H264 == stream_type ? 4 : STREAM_TYPE_H265 == stream_type ? 5 : 0;
            if (header_size && scpos > header_size) {
                packet->status = libcaption_status_update(packet->status, sei_parse(&sei, &packet->data[header_size], scpos - header_size, dts + cts));
                for (sei_message_t* msg = sei_message_head(&sei); msg; msg = sei_message_next(msg)) {
                    if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
                        cea708_t* cea708 = _mpeg_bitstream_cea708_emplace_back(packet, dts + cts);
                        packet->status = libcaption_status_update(packet->status, cea708_parse_h264(sei_message_data(msg), sei_message_size(msg), cea708));
                        _mpeg_bitstream_cea708_sort_flush(packet, frame, dts);
                    }
                }
                sei_free(&sei);
            }
            break;
        }

        packet->size -= scpos;
        memmove(&packet->data[0], &packet->data[scpos], packet->size);
    }

    return size;
}